

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_secp256k1.cpp
# Opt level: O2

ByteData * __thiscall
cfd::core::Secp256k1::SignWhitelistSecp256k1Ec
          (ByteData *__return_storage_ptr__,Secp256k1 *this,ByteData *offline_pubkey,
          ByteData256 *online_privkey,ByteData256 *tweak_sum,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *online_keys,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *offline_keys,
          uint32_t whitelist_index)

{
  void *pvVar1;
  pointer pBVar2;
  pointer pBVar3;
  pointer paVar4;
  pointer paVar5;
  size_t sVar6;
  CfdException *pCVar7;
  long lVar8;
  size_type __new_size;
  ulong uVar9;
  int ret;
  allocator local_2139;
  size_t outlen;
  undefined1 local_2130 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> online_pubkeys;
  vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_> offline_pubkeys;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_20b0;
  secp256k1_pubkey offline_pubkey_secp;
  secp256k1_whitelist_signature signature;
  
  pvVar1 = this->secp256k1_context_;
  if (pvVar1 == (void *)0x0) {
    signature.n_keys =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x68;
    signature.data[0] = 0xfc;
    signature.data[1] = '\x01';
    signature.data[2] = '\0';
    signature.data[3] = '\0';
    signature.data._8_8_ = anon_var_dwarf_1adacb;
    logger::warn<>((CfdSourceLocation *)&signature,"Secp256k1 context is NULL.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&signature,"Secp256k1 context is NULL.",(allocator *)&offline_pubkey_secp);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar6 = ByteData::GetDataSize(offline_pubkey);
  if (sVar6 != 0x21) {
    signature.n_keys =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x68;
    signature.data[0] = '\x01';
    signature.data[1] = '\x02';
    signature.data[2] = '\0';
    signature.data[3] = '\0';
    signature.data._8_8_ = anon_var_dwarf_1adacb;
    logger::warn<>((CfdSourceLocation *)&signature,"Invalid Argument pubkey size.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&signature,"Invalid Pubkey size.",(allocator *)&offline_pubkey_secp);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pBVar2 = (online_keys->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pBVar3 = (online_keys->
           super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar2 == pBVar3) {
    signature.n_keys =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x68;
    signature.data[0] = '\x06';
    signature.data[1] = '\x02';
    signature.data[2] = '\0';
    signature.data[3] = '\0';
    signature.data._8_8_ = anon_var_dwarf_1adacb;
    logger::warn<>((CfdSourceLocation *)&signature,"Invalid Argument online_keys empty.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&signature,"Empty online_keys.",(allocator *)&offline_pubkey_secp);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  lVar8 = (long)pBVar3 - (long)pBVar2;
  if (0x100 < (ulong)(lVar8 / 0x18)) {
    signature.n_keys =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x68;
    signature.data[0] = '\v';
    signature.data[1] = '\x02';
    signature.data[2] = '\0';
    signature.data[3] = '\0';
    signature.data._8_8_ = anon_var_dwarf_1adacb;
    logger::warn<>((CfdSourceLocation *)&signature,"Invalid Argument online_keys maximum over.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&signature,"Invalid online_keys size over.",
               (allocator *)&offline_pubkey_secp);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (lVar8 != (long)(offline_keys->
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(offline_keys->
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                     _M_impl.super__Vector_impl_data._M_start) {
    signature.n_keys =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x68;
    signature.data[0] = '\x10';
    signature.data[1] = '\x02';
    signature.data[2] = '\0';
    signature.data[3] = '\0';
    signature.data._8_8_ = anon_var_dwarf_1adacb;
    logger::warn<>((CfdSourceLocation *)&signature,"Invalid Argument online_keys length.");
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&signature,"Unmatch keylist length.",(allocator *)&offline_pubkey_secp);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_20b0,
                     offline_pubkey);
  ret = secp256k1_ec_pubkey_parse
                  (pvVar1,&offline_pubkey_secp,local_20b0._M_impl.super__Vector_impl_data._M_start,
                   (long)local_20b0._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_20b0._M_impl.super__Vector_impl_data._M_start);
  if (ret != 1) {
    signature.n_keys =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
         + 0x68;
    signature.data[0] = '\x1d';
    signature.data[1] = '\x02';
    signature.data[2] = '\0';
    signature.data[3] = '\0';
    signature.data._8_8_ = anon_var_dwarf_1adacb;
    logger::warn<int&>((CfdSourceLocation *)&signature,
                       "secp256k1_ec_pubkey_parse offline_pubkey Error.({})",&ret);
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&signature,"Secp256k1 offline_pubkey parse Error.",(allocator *)local_2130)
    ;
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            (&online_pubkeys,
             ((long)(online_keys->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(online_keys->
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&signature);
  ::std::vector<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::vector
            (&offline_pubkeys,
             ((long)(offline_keys->
                    super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(offline_keys->
                   super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&signature);
  outlen = 0;
  while( true ) {
    paVar5 = offline_pubkeys.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar4 = online_pubkeys.super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = (long)online_pubkeys.
                  super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)online_pubkeys.
                  super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                  super__Vector_impl_data._M_start >> 6;
    if (uVar9 <= outlen) break;
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2130,
                       (online_keys->
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       )._M_impl.super__Vector_impl_data._M_start + outlen);
    ret = secp256k1_ec_pubkey_parse
                    (pvVar1,online_pubkeys.
                            super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                            _M_impl.super__Vector_impl_data._M_start + outlen,local_2130._0_8_,
                     CONCAT44(local_2130._12_4_,local_2130._8_4_) - local_2130._0_8_);
    if (ret != 1) {
      signature.n_keys =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
           + 0x68;
      signature.data[0] = '-';
      signature.data[1] = '\x02';
      signature.data[2] = '\0';
      signature.data[3] = '\0';
      signature.data._8_8_ = anon_var_dwarf_1adacb;
      logger::warn<unsigned_long&,int&>
                ((CfdSourceLocation *)&signature,"secp256k1_ec_pubkey_parse onlines[{}] Error.({})",
                 &outlen,&ret);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&signature,"Secp256k1 onlines pubkey parse Error.",(allocator *)&output);
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>,
                       (offline_keys->
                       super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                       )._M_impl.super__Vector_impl_data._M_start + outlen);
    ret = secp256k1_ec_pubkey_parse
                    (pvVar1,offline_pubkeys.
                            super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                            _M_impl.super__Vector_impl_data._M_start + outlen,
                     output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    if (ret != 1) {
      signature.n_keys =
           (long)
           "//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_secp256k1.cpp"
           + 0x68;
      signature.data[0] = ':';
      signature.data[1] = '\x02';
      signature.data[2] = '\0';
      signature.data[3] = '\0';
      signature.data._8_8_ = anon_var_dwarf_1adacb;
      logger::warn<unsigned_long&,int&>
                ((CfdSourceLocation *)&signature,"secp256k1_ec_pubkey_parse offlines[{}] Error.({})"
                 ,&outlen,&ret);
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&signature,"Secp256k1 offlines pubkey parse Error.",&local_2139);
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)&signature);
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_2130);
    outlen = outlen + 1;
  }
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_2130,online_privkey);
  ByteData256::GetBytes(&output,tweak_sum);
  ret = secp256k1_whitelist_sign
                  (pvVar1,&signature,paVar4,paVar5,uVar9,&offline_pubkey_secp,local_2130._0_8_,
                   output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,whitelist_index,0,0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_2130);
  if (ret != 1) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x249;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>((CfdSourceLocation *)local_2130,"secp256k1_whitelist_sign Error.({})",&ret);
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_2130,"Secp256k1 whitelist sign Error.",(allocator *)&output);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = secp256k1_whitelist_verify
                  (pvVar1,&signature,
                   online_pubkeys.
                   super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   offline_pubkeys.
                   super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)online_pubkeys.
                         super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)online_pubkeys.
                         super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                         _M_impl.super__Vector_impl_data._M_start >> 6,&offline_pubkey_secp);
  if (ret != 1) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x252;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>((CfdSourceLocation *)local_2130,"secp256k1_whitelist_verify Error.({})",&ret)
    ;
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_2130,"Secp256k1 whitelist verify Error.",(allocator *)&output);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,0x2021,
             (allocator_type *)local_2130);
  __new_size = ((long)online_pubkeys.
                      super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)online_pubkeys.
                      super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 1) + 0x21;
  outlen = __new_size;
  ret = secp256k1_whitelist_signature_serialize
                  (pvVar1,output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_start,&outlen,&signature);
  if (ret != 1) {
    local_2130._0_8_ = "cfdcore_secp256k1.cpp";
    local_2130._8_4_ = 0x25f;
    local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
    logger::warn<int&>((CfdSourceLocation *)local_2130,
                       "secp256k1_whitelist_signature_serialize Error.({})",&ret);
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_2130,"Secp256k1 whitelist signature serialize Error.",&local_2139);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_2130);
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (outlen == __new_size) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&output,__new_size);
    ByteData::ByteData(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::~_Vector_base
              (&offline_pubkeys.
                super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>);
    ::std::_Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>::~_Vector_base
              (&online_pubkeys.
                super__Vector_base<secp256k1_pubkey,_std::allocator<secp256k1_pubkey>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_20b0);
    return __return_storage_ptr__;
  }
  local_2130._0_8_ = "cfdcore_secp256k1.cpp";
  local_2130._8_4_ = 0x267;
  local_2130._16_8_ = "SignWhitelistSecp256k1Ec";
  logger::warn<unsigned_long&>
            ((CfdSourceLocation *)local_2130,
             "secp256k1_whitelist_signature_serialize size Error.({})",&outlen);
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)local_2130,"Secp256k1 whitelist signature serialize size Error.",&local_2139)
  ;
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,(string *)local_2130);
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData Secp256k1::SignWhitelistSecp256k1Ec(
    const ByteData& offline_pubkey, const ByteData256& online_privkey,
    const ByteData256& tweak_sum, const std::vector<ByteData>& online_keys,
    const std::vector<ByteData>& offline_keys, uint32_t whitelist_index) {
  static constexpr uint32_t kWhitelistCountMaximum = 256;
  static constexpr uint32_t kPrivkeySize = 32;
  static constexpr uint32_t kOutputMaxSize =
      1 + (kPrivkeySize * (1 + kWhitelistCountMaximum));
  secp256k1_context* context =
      static_cast<secp256k1_context*>(secp256k1_context_);

  if (secp256k1_context_ == NULL) {
    warn(CFD_LOG_SOURCE, "Secp256k1 context is NULL.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 context is NULL.");
  }
  if (offline_pubkey.GetDataSize() != 33) {
    warn(CFD_LOG_SOURCE, "Invalid Argument pubkey size.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Pubkey size.");
  }
  if (online_keys.empty()) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys empty.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Empty online_keys.");
  }
  if (online_keys.size() > kWhitelistCountMaximum) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys maximum over.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid online_keys size over.");
  }
  if (online_keys.size() != offline_keys.size()) {
    warn(CFD_LOG_SOURCE, "Invalid Argument online_keys length.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch keylist length.");
  }

  int ret;
  const std::vector<uint8_t>& offline_pubkey_data = offline_pubkey.GetBytes();
  secp256k1_pubkey offline_pubkey_secp;
  ret = secp256k1_ec_pubkey_parse(
      context, &offline_pubkey_secp, offline_pubkey_data.data(),
      offline_pubkey_data.size());
  if (ret != 1) {
    warn(
        CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse offline_pubkey Error.({})",
        ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 offline_pubkey parse Error.");
  }

  std::vector<secp256k1_pubkey> online_pubkeys(online_keys.size());
  std::vector<secp256k1_pubkey> offline_pubkeys(offline_keys.size());
  for (size_t index = 0; index < online_pubkeys.size(); ++index) {
    const std::vector<uint8_t>& online_data = online_keys[index].GetBytes();
    ret = secp256k1_ec_pubkey_parse(
        context, &online_pubkeys[index], online_data.data(),
        online_data.size());
    if (ret != 1) {
      warn(
          CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse onlines[{}] Error.({})",
          index, ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 onlines pubkey parse Error.");
    }

    const std::vector<uint8_t>& offline_data = offline_keys[index].GetBytes();
    ret = secp256k1_ec_pubkey_parse(
        context, &offline_pubkeys[index], offline_data.data(),
        offline_data.size());
    if (ret != 1) {
      warn(
          CFD_LOG_SOURCE, "secp256k1_ec_pubkey_parse offlines[{}] Error.({})",
          index, ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Secp256k1 offlines pubkey parse Error.");
    }
  }

  secp256k1_whitelist_signature signature;
  ret = secp256k1_whitelist_sign(
      context, &signature, online_pubkeys.data(), offline_pubkeys.data(),
      online_pubkeys.size(), &offline_pubkey_secp,
      online_privkey.GetBytes().data(), tweak_sum.GetBytes().data(),
      whitelist_index, nullptr, nullptr);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_whitelist_sign Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Secp256k1 whitelist sign Error.");
  }

  ret = secp256k1_whitelist_verify(
      context, &signature, online_pubkeys.data(), offline_pubkeys.data(),
      online_pubkeys.size(), &offline_pubkey_secp);
  if (ret != 1) {
    warn(CFD_LOG_SOURCE, "secp256k1_whitelist_verify Error.({})", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist verify Error.");
  }

  std::vector<uint8_t> output(kOutputMaxSize);
  size_t output_size = 1 + (kPrivkeySize * (1 + online_pubkeys.size()));
  size_t outlen = output_size;
  ret = secp256k1_whitelist_signature_serialize(
      context, output.data(), &outlen, &signature);
  if (ret != 1) {
    warn(
        CFD_LOG_SOURCE, "secp256k1_whitelist_signature_serialize Error.({})",
        ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist signature serialize Error.");
  }
  if (outlen != output_size) {
    warn(
        CFD_LOG_SOURCE,
        "secp256k1_whitelist_signature_serialize size Error.({})", outlen);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Secp256k1 whitelist signature serialize size Error.");
  }
  output.resize(output_size);
  return ByteData(output);
}